

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O2

void __thiscall duckdb::ArenaAllocator::Reset(ArenaAllocator *this)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var1;
  type current_next;
  __uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> local_18;
  
  _Var1._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ArenaChunk *)0x0) {
    local_18._M_t.
    super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
    super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl =
         *(tuple<duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_> *)
          &((_Var1._M_head_impl)->next).
           super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>;
    if (local_18._M_t.
        super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
        super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>)0x0) {
      ((_Var1._M_head_impl)->next).
      super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> =
           (unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>)0x0;
      while ((_Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>)
             local_18._M_t.
             super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
             super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl != (ArenaChunk *)0x0) {
        ::std::__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::
        operator=(&local_18,
                  (__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                  ((long)local_18._M_t.
                         super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>
                         .super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl + 0x28));
      }
      ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::~unique_ptr
                ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                 &local_18);
      _Var1._M_head_impl =
           (this->head).
           super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
           super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
           super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
    }
    this->tail = _Var1._M_head_impl;
    (_Var1._M_head_impl)->current_position = 0;
    (_Var1._M_head_impl)->prev = (ArenaChunk *)0x0;
  }
  this->allocated_size = 0;
  return;
}

Assistant:

void ArenaAllocator::Reset() {
	if (head) {
		// destroy all chunks except the current one
		if (head->next) {
			auto current_next = std::move(head->next);
			while (current_next) {
				current_next = std::move(current_next->next);
			}
		}
		tail = head.get();

		// reset the head
		head->current_position = 0;
		head->prev = nullptr;
	}
	allocated_size = 0;
}